

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_5::ParallelNodeHashMap_IteratesMsan_Test::TestBody
          (ParallelNodeHashMap_IteratesMsan_Test *this)

{
  allocator_type *paVar1;
  ostream *os;
  pair<const_int,_phmap::priv::(anonymous_namespace)::balast> *x;
  uint uVar2;
  ushort uVar3;
  byte bVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  size_t i;
  AssertHelperData *pAVar8;
  undefined8 *puVar9;
  undefined4 *puVar10;
  ostream *poVar11;
  AssertionResult *other;
  ulong uVar12;
  allocator_type *__a;
  ulong uVar13;
  long lVar14;
  ulong hashval;
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  *__args;
  type_info *type;
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  *extraout_RDX;
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  *extraout_RDX_00;
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  *ppVar15;
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  *extraout_RDX_01;
  AssertHelper *unaff_RBX;
  AssertHelper *pAVar16;
  ulong uVar17;
  allocator_type *__p;
  long lVar18;
  char *pcVar19;
  uint uVar20;
  Type *pTVar21;
  Type TVar22;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  *this_00;
  bool bVar23;
  __m128i match;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  AssertionResult gtest_ar;
  vector<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
  garbage;
  Matcher<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&> matcher;
  iterator it;
  StringMatchResultListener inner_listener;
  StringMatchResultListener listener;
  ThisMap<int,_balast> t;
  stringstream ss;
  undefined1 local_8d8 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_8d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8c8;
  undefined1 local_8b8 [8];
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8b0;
  undefined1 local_8a8 [16];
  allocator_type *local_898;
  allocator_type *local_888;
  int local_87c;
  undefined1 local_878 [16];
  undefined4 *puStack_868;
  allocator_type *local_860;
  allocator_type *local_858;
  iterator local_850;
  long *local_820;
  long local_818;
  long local_810 [2];
  ulong local_800;
  ios_base *local_7f8;
  ios_base *local_7f0;
  undefined1 local_7e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7d8;
  undefined1 local_7c8 [112];
  ios_base aiStack_758 [264];
  AssertHelper local_650;
  ostream *local_648;
  stringstream local_640 [16];
  ostream local_630 [112];
  ios_base aiStack_5c0 [264];
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  local_4b8;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  char cVar28;
  char cVar30;
  char cVar31;
  char cVar32;
  
  local_8a8 = (undefined1  [16])0x0;
  local_898 = (allocator_type *)0x0;
  os = (ostream *)(local_1b8 + 0x10);
  local_7f8 = aiStack_758;
  local_7f0 = aiStack_5c0;
  iVar6 = 0;
  do {
    lVar7 = 0;
    do {
      *(undefined1 **)
       ((long)&local_4b8.
               super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .
               super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .sets_._M_elems[0].set_ + lVar7) =
           &EmptyGroup<std::is_same<std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>>>()
            ::empty_group;
      *(undefined8 *)
       ((long)&local_4b8.
               super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .
               super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .sets_._M_elems[0].set_ + lVar7 + 0x28) = 0;
      *(undefined1 (*) [16])
       ((long)&local_4b8.
               super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .
               super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .sets_._M_elems[0].set_ + lVar7 + 8) = (undefined1  [16])0x0;
      *(undefined8 *)
       ((long)&local_4b8.
               super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .
               super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .sets_._M_elems[0].set_ + lVar7 + 0x18) = 0;
      lVar7 = lVar7 + 0x30;
    } while (lVar7 != 0x300);
    uVar12 = 0;
    local_87c = iVar6;
    do {
      TVar22 = (Type)uVar12;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar12;
      hashval = SUB168(auVar24 * ZEXT816(0xde5fb9d2630458e9),8) +
                SUB168(auVar24 * ZEXT816(0xde5fb9d2630458e9),0);
      uVar17 = (ulong)((((uint)(hashval >> 0x18) & 0xff ^
                        (uint)(hashval >> 8) & 0xffffff ^ (uint)(hashval >> 0x10) & 0xffff) & 0xf) *
                      0x30);
      uVar12 = *(ulong *)((long)&local_4b8.
                                 super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                                 .
                                 super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                                 .sets_._M_elems[0].set_ + uVar17 + 0x18);
      if ((uVar12 + 1 & uVar12) != 0) {
        __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
      }
      this_00 = (raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                 *)((long)&local_4b8.
                           super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                           .
                           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                           .sets_._M_elems[0].set_ + uVar17);
      uVar13 = hashval >> 7 & uVar12;
      lVar7 = *(long *)((long)&local_4b8.
                               super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                               .
                               super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                               .sets_._M_elems[0].set_ + uVar17 + 8);
      bVar4 = (byte)hashval;
      local_888 = (allocator_type *)CONCAT44(local_888._4_4_,(uint)(bVar4 & 0x7f));
      auVar24 = ZEXT216(CONCAT11(bVar4,bVar4) & 0x7f7f);
      auVar24 = pshuflw(auVar24,auVar24,0);
      lVar18 = 0;
      pAVar16 = unaff_RBX;
      do {
        auVar26 = *(undefined1 (*) [16])(this_00->ctrl_ + uVar13);
        cVar28 = auVar24[0];
        auVar29[0] = -(cVar28 == auVar26[0]);
        cVar30 = auVar24[1];
        auVar29[1] = -(cVar30 == auVar26[1]);
        cVar31 = auVar24[2];
        auVar29[2] = -(cVar31 == auVar26[2]);
        cVar32 = auVar24[3];
        auVar29[3] = -(cVar32 == auVar26[3]);
        auVar29[4] = -(cVar28 == auVar26[4]);
        auVar29[5] = -(cVar30 == auVar26[5]);
        auVar29[6] = -(cVar31 == auVar26[6]);
        auVar29[7] = -(cVar32 == auVar26[7]);
        auVar29[8] = -(cVar28 == auVar26[8]);
        auVar29[9] = -(cVar30 == auVar26[9]);
        auVar29[10] = -(cVar31 == auVar26[10]);
        auVar29[0xb] = -(cVar32 == auVar26[0xb]);
        auVar29[0xc] = -(cVar28 == auVar26[0xc]);
        auVar29[0xd] = -(cVar30 == auVar26[0xd]);
        auVar29[0xe] = -(cVar31 == auVar26[0xe]);
        auVar29[0xf] = -(cVar32 == auVar26[0xf]);
        uVar3 = (ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf;
        bVar23 = uVar3 == 0;
        if (bVar23) {
LAB_00132589:
          iVar6 = 4;
          unaff_RBX = pAVar16;
        }
        else {
          uVar20 = (uint)uVar3;
          uVar2 = 0;
          if (uVar3 != 0) {
            for (; (uVar3 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
            }
          }
          unaff_RBX = (AssertHelper *)(uVar2 + uVar13 & uVar12);
          iVar6 = 1;
          pTVar21 = *(Type **)(lVar7 + (long)unaff_RBX * 8);
          while (*pTVar21 != TVar22) {
            uVar20 = uVar20 - 1 & uVar20;
            bVar23 = uVar20 == 0;
            if (bVar23) goto LAB_00132589;
            uVar2 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
              }
            }
            unaff_RBX = (AssertHelper *)(uVar2 + uVar13 & uVar12);
            pTVar21 = *(Type **)(lVar7 + (long)unaff_RBX * 8);
          }
          bVar23 = false;
        }
        if (bVar23) {
          auVar25[0] = -(auVar26[0] == -0x80);
          auVar25[1] = -(auVar26[1] == -0x80);
          auVar25[2] = -(auVar26[2] == -0x80);
          auVar25[3] = -(auVar26[3] == -0x80);
          auVar25[4] = -(auVar26[4] == -0x80);
          auVar25[5] = -(auVar26[5] == -0x80);
          auVar25[6] = -(auVar26[6] == -0x80);
          auVar25[7] = -(auVar26[7] == -0x80);
          auVar25[8] = -(auVar26[8] == -0x80);
          auVar25[9] = -(auVar26[9] == -0x80);
          auVar25[10] = -(auVar26[10] == -0x80);
          auVar25[0xb] = -(auVar26[0xb] == -0x80);
          auVar25[0xc] = -(auVar26[0xc] == -0x80);
          auVar25[0xd] = -(auVar26[0xd] == -0x80);
          auVar25[0xe] = -(auVar26[0xe] == -0x80);
          auVar25[0xf] = -(auVar26[0xf] == -0x80);
          iVar6 = 3;
          if ((((((((((((((((auVar25 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar25 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar25 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar25 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar25 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar25 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar25 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar25 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar25 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar25 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar25 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar25 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar25 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar25 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar25 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar25[0xf]) {
            lVar14 = uVar13 + lVar18;
            lVar18 = lVar18 + 0x10;
            uVar13 = lVar14 + 0x10U & uVar12;
            iVar6 = 0;
          }
        }
        pAVar16 = unaff_RBX;
      } while (iVar6 == 0);
      if (iVar6 == 3) {
        unaff_RBX = (AssertHelper *)0xffffffffffffffff;
      }
      if (unaff_RBX == (AssertHelper *)0xffffffffffffffff) {
        i = raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
            ::prepare_insert(this_00,hashval);
        unaff_RBX = *(AssertHelper **)
                     ((long)&local_4b8.
                             super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                             .
                             super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                             .sets_._M_elems[0].set_ + uVar17 + 8);
        pAVar8 = (AssertHelperData *)operator_new(8);
        pAVar8->type = TVar22;
        unaff_RBX[i].data_ = pAVar8;
        raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
        ::set_ctrl(this_00,i,(ctrl_t)local_888);
      }
      cVar28 = *local_4b8.
                super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                .
                super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                .sets_._M_elems[0].set_.ctrl_;
      local_850.it_.ctrl_ =
           local_4b8.
           super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .
           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .sets_._M_elems[0].set_.ctrl_;
      local_850.it_.field_1.slot_ =
           local_4b8.
           super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .
           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .sets_._M_elems[0].set_.slots_;
      while (cVar28 < -1) {
        auVar26[0] = -(*local_850.it_.ctrl_ < -1);
        auVar26[1] = -(local_850.it_.ctrl_[1] < -1);
        auVar26[2] = -(local_850.it_.ctrl_[2] < -1);
        auVar26[3] = -(local_850.it_.ctrl_[3] < -1);
        auVar26[4] = -(local_850.it_.ctrl_[4] < -1);
        auVar26[5] = -(local_850.it_.ctrl_[5] < -1);
        auVar26[6] = -(local_850.it_.ctrl_[6] < -1);
        auVar26[7] = -(local_850.it_.ctrl_[7] < -1);
        auVar26[8] = -(local_850.it_.ctrl_[8] < -1);
        auVar26[9] = -(local_850.it_.ctrl_[9] < -1);
        auVar26[10] = -(local_850.it_.ctrl_[10] < -1);
        auVar26[0xb] = -(local_850.it_.ctrl_[0xb] < -1);
        auVar26[0xc] = -(local_850.it_.ctrl_[0xc] < -1);
        auVar26[0xd] = -(local_850.it_.ctrl_[0xd] < -1);
        auVar26[0xe] = -(local_850.it_.ctrl_[0xe] < -1);
        auVar26[0xf] = -(local_850.it_.ctrl_[0xf] < -1);
        uVar20 = (ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                         (ushort)(auVar26[0xf] >> 7) << 0xf) + 1;
        uVar2 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        local_850.it_.field_1.slot_ = local_850.it_.field_1.slot_ + uVar2;
        cVar28 = local_850.it_.ctrl_[uVar2];
        local_850.it_.ctrl_ = local_850.it_.ctrl_ + uVar2;
      }
      local_850.inner_ = (Inner *)&local_4b8;
      local_850.inner_end_ = (Inner *)local_1b8;
      local_850.it_end_.ctrl_ =
           local_4b8.
           super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .
           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .sets_._M_elems[0].set_.ctrl_ +
           local_4b8.
           super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .
           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .sets_._M_elems[0].set_.capacity_;
      while (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
             ::iterator::skip_empty(&local_850),
            (parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
             *)local_850.inner_ !=
            (parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
             *)0x0) {
        x = *local_850.it_.field_1.slot_;
        puVar9 = (undefined8 *)operator_new(0x38);
        *puVar9 = &PTR__PairMatcherImpl_0033c310;
        *(undefined1 (*) [16])(puVar9 + 2) = (undefined1  [16])0x0;
        puVar9[2] = testing::internal::MatcherBase<int_const&>::
                    GetVTable<testing::internal::MatcherBase<int_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
                    ::kVTable;
        puVar9[1] = &PTR__MatcherBase_0033ce30;
        *(undefined1 (*) [16])(puVar9 + 5) = (undefined1  [16])0x0;
        puVar9[5] = testing::internal::
                    MatcherBase<phmap::priv::(anonymous_namespace)::balast_const&>::
                    GetVTable<testing::internal::MatcherBase<phmap::priv::(anonymous_namespace)::balast_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
                    ::kVTable;
        puVar9[4] = &PTR__MatcherBase_0033c378;
        local_878._0_8_ = &PTR__MatcherBase_0033c4a8;
        stack0xfffffffffffff790 = ZEXT816(0x33c4c8);
        puVar10 = (undefined4 *)operator_new(0x10);
        *puVar10 = 1;
        *(undefined8 **)(puVar10 + 2) = puVar9;
        puStack_868 = puVar10;
        local_878._0_8_ = &PTR__MatcherBase_0033c438;
        local_7e8._8_8_ = (undefined1 *)0x0;
        local_7e8._0_8_ = &PTR__MatchResultListener_0033cef0;
        bVar23 = testing::internal::
                 MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                 ::MatchAndExplain((MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                                    *)local_878,x,(MatchResultListener *)local_7e8);
        if (bVar23) {
          testing::AssertionSuccess();
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>(os,"Value of: ",10);
          std::__ostream_insert<char,std::char_traits<char>>(os,"p",1);
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(os,"Expected: ",10);
          testing::internal::
          MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>::
          DescribeTo((MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                      *)local_878,os);
          local_648 = local_630;
          local_650.data_ = (AssertHelperData *)&PTR__StringMatchResultListener_0033cf58;
          std::__cxx11::stringstream::stringstream(local_640);
          if (local_648 == (ostream *)0x0) {
            local_7e8._8_8_ = (undefined1 *)0x0;
            local_7e8._0_8_ = &PTR__MatchResultListener_0033cef0;
            bVar23 = testing::internal::
                     MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                     ::MatchAndExplain((MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                                        *)local_878,x,(MatchResultListener *)local_7e8);
          }
          else {
            local_7e8._8_8_ = local_7c8;
            local_7e8._0_8_ = &PTR__StringMatchResultListener_0033cf58;
            std::__cxx11::stringstream::stringstream((stringstream *)(local_7e8 + 0x10));
            bVar23 = testing::internal::
                     MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                     ::MatchAndExplain((MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                                        *)local_878,x,(MatchResultListener *)local_7e8);
            poVar11 = local_648;
            local_8d8[0] = true;
            std::__ostream_insert<char,std::char_traits<char>>(local_648,local_8d8,1);
            std::ostream::operator<<((ostream *)poVar11,x->first);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
            testing::internal::PrintBytesInObjectTo(&x->field_0x4,1,poVar11);
            local_8d8[0] = true;
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_8d8,1);
            testing::internal::GetTypeName_abi_cxx11_
                      ((string *)local_8d8,
                       (internal *)
                       &std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>::typeinfo,
                       type);
            if ((local_8d0._M_head_impl < 0x15) ||
               (lVar7 = std::__cxx11::string::find_first_of(local_8d8,0x29a497,0), lVar7 == -1)) {
              poVar11 = local_648;
              std::__ostream_insert<char,std::char_traits<char>>(local_648," (of type ",10);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar11,(char *)CONCAT71(local_8d8._1_7_,local_8d8[0]),
                                   (long)local_8d0._M_head_impl);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
            }
            std::__cxx11::stringbuf::str();
            poVar11 = local_648;
            if ((local_648 != (ostream *)0x0) && (local_818 != 0)) {
              std::__ostream_insert<char,std::char_traits<char>>(local_648,", ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_820,local_818);
            }
            if (local_820 != local_810) {
              operator_delete(local_820,local_810[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_8d8._1_7_,local_8d8[0]) != &local_8c8) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_8d8._1_7_,local_8d8[0]),
                              local_8c8._M_allocated_capacity + 1);
            }
            local_7e8._0_8_ = &PTR__StringMatchResultListener_0033cf58;
            std::__cxx11::stringstream::~stringstream((stringstream *)(local_7e8 + 0x10));
            std::ios_base::~ios_base(local_7f8);
          }
          if (bVar23 != false) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (os,
                       "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                       ,0x60);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Actual: ",0xb);
          std::__cxx11::stringbuf::str();
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,(char *)local_7e8._0_8_,local_7e8._8_8_);
          if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
            operator_delete((void *)local_7e8._0_8_,local_7d8._M_allocated_capacity + 1);
          }
          testing::AssertionFailure();
          std::__cxx11::stringbuf::str();
          other = testing::AssertionResult::operator<<
                            ((AssertionResult *)local_8d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_7e8);
          testing::AssertionResult::AssertionResult((AssertionResult *)local_8b8,other);
          if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
            operator_delete((void *)local_7e8._0_8_,local_7d8._M_allocated_capacity + 1);
          }
          if (local_8d0._M_head_impl !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_8d0,local_8d0._M_head_impl);
          }
          local_650.data_ = (AssertHelperData *)&PTR__StringMatchResultListener_0033cf58;
          std::__cxx11::stringstream::~stringstream(local_640);
          std::ios_base::~ios_base(local_7f0);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
        }
        testing::internal::
        MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>::
        ~MatcherBase((MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                      *)local_878);
        unaff_RBX = &local_650;
        if (local_8b8[0] == false) {
          testing::Message::Message((Message *)local_7e8);
          pcVar19 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_8b0._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar19 = *(char **)local_8b0._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (unaff_RBX,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/flat_hash_map_test.cc"
                     ,0x86,pcVar19);
          testing::internal::AssertHelper::operator=(unaff_RBX,(Message *)local_7e8);
          testing::internal::AssertHelper::~AssertHelper(unaff_RBX);
          if ((undefined **)local_7e8._0_8_ != (undefined **)0x0) {
            (**(code **)(*(undefined **)local_7e8._0_8_ + 8))();
          }
        }
        if (local_8b0._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
            (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_8b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8b0._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
        }
        if ((parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
             *)local_850.inner_ ==
            (parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
             *)0x0) {
          __assert_fail("inner_",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0xa95,
                        "iterator &phmap::priv::parallel_hash_set<4, phmap::priv::raw_hash_set, phmap::NullMutex, phmap::priv::NodeHashMapPolicy<int, phmap::priv::(anonymous namespace)::balast>, phmap::Hash<int32_t>, phmap::EqualTo<int>, std::allocator<std::pair<const int, phmap::priv::(anonymous namespace)::balast>>>::iterator::operator++() [N = 4, RefSet = phmap::priv::raw_hash_set, Mtx_ = phmap::NullMutex, Policy = phmap::priv::NodeHashMapPolicy<int, phmap::priv::(anonymous namespace)::balast>, Hash = phmap::Hash<int32_t>, Eq = phmap::EqualTo<int>, Alloc = std::allocator<std::pair<const int, phmap::priv::(anonymous namespace)::balast>>]"
                       );
        }
        local_850.it_.field_1.slot_ = local_850.it_.field_1.slot_ + 1;
        cVar28 = local_850.it_.ctrl_[1];
        local_850.it_.ctrl_ = local_850.it_.ctrl_ + 1;
        while (cVar28 < -1) {
          auVar27[0] = -(*local_850.it_.ctrl_ < -1);
          auVar27[1] = -(local_850.it_.ctrl_[1] < -1);
          auVar27[2] = -(local_850.it_.ctrl_[2] < -1);
          auVar27[3] = -(local_850.it_.ctrl_[3] < -1);
          auVar27[4] = -(local_850.it_.ctrl_[4] < -1);
          auVar27[5] = -(local_850.it_.ctrl_[5] < -1);
          auVar27[6] = -(local_850.it_.ctrl_[6] < -1);
          auVar27[7] = -(local_850.it_.ctrl_[7] < -1);
          auVar27[8] = -(local_850.it_.ctrl_[8] < -1);
          auVar27[9] = -(local_850.it_.ctrl_[9] < -1);
          auVar27[10] = -(local_850.it_.ctrl_[10] < -1);
          auVar27[0xb] = -(local_850.it_.ctrl_[0xb] < -1);
          auVar27[0xc] = -(local_850.it_.ctrl_[0xc] < -1);
          auVar27[0xd] = -(local_850.it_.ctrl_[0xd] < -1);
          auVar27[0xe] = -(local_850.it_.ctrl_[0xe] < -1);
          auVar27[0xf] = -(local_850.it_.ctrl_[0xf] < -1);
          uVar20 = (ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                           (ushort)(auVar27[0xf] >> 7) << 0xf) + 1;
          uVar2 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
            }
          }
          pcVar19 = local_850.it_.ctrl_ + uVar2;
          local_850.it_.ctrl_ = local_850.it_.ctrl_ + uVar2;
          local_850.it_.field_1.slot_ = local_850.it_.field_1.slot_ + uVar2;
          cVar28 = *pcVar19;
        }
      }
      uVar12 = (ulong)(TVar22 + kNonFatalFailure);
    } while (TVar22 + kNonFatalFailure != 100);
    uVar5 = local_8a8._8_8_;
    if ((allocator_type *)local_8a8._8_8_ == local_898) {
      __p = (allocator_type *)local_8a8._0_8_;
      if (local_8a8._8_8_ - local_8a8._0_8_ == 0x7ffffffffffffe00) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      lVar7 = (long)(local_8a8._8_8_ - local_8a8._0_8_) >> 8;
      uVar17 = lVar7 * -0x5555555555555555;
      uVar12 = uVar17;
      if (local_8a8._8_8_ == local_8a8._0_8_) {
        uVar12 = 1;
      }
      local_800 = uVar12 + uVar17;
      if (0x2aaaaaaaaaaaa9 < local_800) {
        local_800 = 0x2aaaaaaaaaaaaa;
      }
      if (CARRY8(uVar12,uVar17)) {
        local_800 = 0x2aaaaaaaaaaaaa;
      }
      if (local_800 == 0) {
        __a = (allocator_type *)0x0;
        ppVar15 = __args;
      }
      else {
        __a = (allocator_type *)operator_new(local_800 * 0x300);
        ppVar15 = extraout_RDX;
      }
      std::
      allocator_traits<std::allocator<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>>
      ::
      construct<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>,phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>
                (__a + lVar7 * 0x100,&local_4b8,ppVar15);
      local_858 = __p;
      local_860 = __a;
      if ((allocator_type *)uVar5 != __p) {
        local_888 = (allocator_type *)uVar5;
        ppVar15 = extraout_RDX_00;
        do {
          std::
          allocator_traits<std::allocator<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>>
          ::
          construct<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>,phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>
                    (__a,(parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
                          *)__p,ppVar15);
          paVar1 = __p + 0x300;
          lVar7 = 0x2d0;
          do {
            raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
            ::~raw_hash_set((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                             *)(__p + lVar7));
            lVar7 = lVar7 + -0x30;
          } while (lVar7 != -0x30);
          __a = __a + 0x300;
          ppVar15 = extraout_RDX_01;
          __p = paVar1;
        } while (paVar1 != local_888);
      }
      if (local_858 != (allocator_type *)0x0) {
        operator_delete(local_858,(long)local_898 - (long)local_858);
      }
      local_8a8._8_8_ = __a + 0x300;
      local_8a8._0_8_ = local_860;
      local_898 = local_860 + local_800 * 0x300;
    }
    else {
      std::
      allocator_traits<std::allocator<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>>
      ::
      construct<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>,phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>
                ((allocator_type *)local_8a8._8_8_,&local_4b8,__args);
      local_8a8._8_8_ = (allocator_type *)(uVar5 + 0x300);
    }
    lVar7 = 0x2d0;
    do {
      raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
      ::~raw_hash_set((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                       *)((long)&local_4b8.
                                 super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                                 .
                                 super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                                 .sets_._M_elems[0].set_ + lVar7));
      lVar7 = lVar7 + -0x30;
    } while (lVar7 != -0x30);
    iVar6 = local_87c + 1;
    unaff_RBX = (AssertHelper *)0xffffffffffffffd0;
    if (iVar6 == 100) {
      std::
      vector<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
      ::~vector((vector<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
                 *)local_8a8);
      return;
    }
  } while( true );
}

Assistant:

bool operator==(const Int& other) const { return value == other.value; }